

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

void __thiscall
pbrt::ImageTextureBase::ImageTextureBase
          (ImageTextureBase *this,TextureMapping2DHandle *mapping,string *filename,string *filter,
          Float maxAniso,WrapMode wrapMode,Float scale,ColorEncodingHandle *encoding,Allocator alloc
          )

{
  MIPMap *pMVar1;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_10;
  
  (this->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = 0;
  (this->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = (mapping->
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          ).bits;
  this->scale = scale;
  local_10.bits =
       (encoding->
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       ).bits;
  pMVar1 = GetTexture(filename,filter,maxAniso,wrapMode,(ColorEncodingHandle *)&local_10,alloc);
  this->mipmap = pMVar1;
  return;
}

Assistant:

ImageTextureBase::ImageTextureBase(TextureMapping2DHandle mapping,
                                   const std::string &filename, const std::string &filter,
                                   Float maxAniso, WrapMode wrapMode, Float scale,
                                   ColorEncodingHandle encoding, Allocator alloc)
    : mapping(std::move(mapping)), scale(scale) {
    mipmap = GetTexture(filename, filter, maxAniso, wrapMode, encoding, alloc);
}